

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O2

GLboolean __thiscall
glcts::TextureCubeMapArrayTextureSizeTFBase::checkResults
          (TextureCubeMapArrayTextureSizeTFBase *this,GLuint width,GLuint height,GLuint depth,
          STORAGE_TYPE storType)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  GLuint GVar2;
  GLuint GVar3;
  uint uVar4;
  GLuint GVar5;
  GLuint GVar6;
  uint uVar7;
  GLboolean GVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 extraout_var;
  GLuint *pGVar12;
  MessageBuilder *pMVar13;
  undefined **ppuVar14;
  undefined1 local_1b0 [384];
  long lVar11;
  
  iVar9 = (*((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar9);
  pGVar12 = (GLuint *)(**(code **)(lVar11 + 0xd00))(0x8c8e,0,0x18,1);
  dVar10 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar10,"Error mapping buffer object\'s data store to client\'s address space.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x1dd);
  GVar2 = *pGVar12;
  GVar3 = pGVar12[1];
  uVar4 = pGVar12[2];
  GVar5 = pGVar12[3];
  GVar6 = pGVar12[4];
  uVar7 = pGVar12[5];
  (**(code **)(lVar11 + 0x1670))(0x8c8e);
  dVar10 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar10,"Error ummapping transform feedback buffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x1e4);
  GVar8 = '\x01';
  if (uVar4 != depth / 6 || (GVar3 != height || GVar2 != width)) {
    local_1b0._0_8_ =
         ((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Storage Type: ");
    ppuVar14 = &imMutableStorage;
    if (storType == ST_MUTABLE) {
      ppuVar14 = (undefined **)&mutableStorage;
    }
    pMVar13 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,ppuVar14);
    poVar1 = &pMVar13->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "textureSize() for samplerCubeArray returned wrong values. [width][height][layers]. They are equal "
                   );
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] but should be ");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"].");
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    GVar8 = '\0';
  }
  if (((GVar5 != width) || (GVar6 != height)) || (uVar7 != depth / 6)) {
    local_1b0._0_8_ =
         ((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Storage Type: ");
    ppuVar14 = &imMutableStorage;
    if (storType == ST_MUTABLE) {
      ppuVar14 = (undefined **)&mutableStorage;
    }
    pMVar13 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,ppuVar14);
    poVar1 = &pMVar13->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "textureSize() for samplerCubeArrayShadow returned wrong values. [width][height][layers]. They are equal "
                   );
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] but should be ");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"[");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"][");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"].");
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    GVar8 = '\0';
  }
  return GVar8;
}

Assistant:

glw::GLboolean TextureCubeMapArrayTextureSizeTFBase::checkResults(glw::GLuint width, glw::GLuint height,
																  glw::GLuint depth, STORAGE_TYPE storType)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Read results from transform feedback */
	glw::GLuint* temp_buff = (glw::GLuint*)gl.mapBufferRange(
		GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_n_varyings * m_n_tf_components * sizeof(glw::GLuint), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data store to client's address space.");

	/* Copy results to helper buffer */
	glw::GLuint read_size[m_n_varyings * m_n_tf_components];
	memcpy(read_size, temp_buff, m_n_varyings * m_n_tf_components * sizeof(glw::GLint));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error ummapping transform feedback buffer.");

	glw::GLboolean test_passed = true;

	/* Elements under index 0-2 contain result of textureSize called for samplerCubeArray sampler */
	if (read_size[0] != width || read_size[1] != height || read_size[2] != (depth / m_n_layers_per_cube))
	{
		getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Storage Type: " << ((storType == ST_MUTABLE) ? mutableStorage : imMutableStorage) << "\n"
			<< "textureSize() for samplerCubeArray returned wrong values. [width][height][layers]. They are equal "
			<< "[" << read_size[0] << "][" << read_size[1] << "][" << read_size[2] << "] but should be "
			<< "[" << width << "][" << height << "][" << depth / m_n_layers_per_cube << "]."
			<< tcu::TestLog::EndMessage;
		test_passed = false;
	}

	/* Elements under index 3-5 contain result of textureSize called for samplerCubeArrayShadow sampler */
	if (read_size[3] != width || read_size[4] != height || read_size[5] != (depth / m_n_layers_per_cube))
	{
		getTestContext().getLog() << tcu::TestLog::Message
								  << "Storage Type: " << ((storType == ST_MUTABLE) ? mutableStorage : imMutableStorage)
								  << "\n"
								  << "textureSize() for samplerCubeArrayShadow returned wrong values. "
									 "[width][height][layers]. They are equal "
								  << "[" << read_size[3] << "][" << read_size[4] << "][" << read_size[5]
								  << "] but should be "
								  << "[" << width << "][" << height << "][" << depth / m_n_layers_per_cube << "]."
								  << tcu::TestLog::EndMessage;
		test_passed = false;
	}

	return test_passed;
}